

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_read_vec2_float(void *a,float **uv,trico_stream_type st)

{
  trico_stream_type tVar1;
  ssize_t sVar2;
  uint32_t local_5c;
  float *pfStack_58;
  uint32_t nr_of_floats_v;
  float *decompressed_v;
  float *pfStack_48;
  uint32_t nr_of_floats_u;
  float *decompressed_u;
  void *compressed;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_vec2_positions;
  trico_archive *arch;
  float **ppfStack_20;
  trico_stream_type st_local;
  float **uv_local;
  void *a_local;
  
  _nr_of_compressed_bytes = (trico_archive *)a;
  arch._4_4_ = st;
  ppfStack_20 = uv;
  uv_local = (float **)a;
  tVar1 = trico_get_next_stream_type(a);
  if (tVar1 == arch._4_4_) {
    sVar2 = read((int)&compressed + 4,(void *)0x4,1);
    if ((int)sVar2 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      sVar2 = read((int)&compressed,(void *)0x4,1);
      if ((int)sVar2 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        decompressed_u = (float *)trico_malloc((ulong)(uint)compressed);
        sVar2 = read((int)decompressed_u,(void *)0x1,(ulong)(uint)compressed);
        if ((int)sVar2 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          trico_decompress((uint32_t *)((long)&decompressed_v + 4),&stack0xffffffffffffffb8,
                           (uint8_t *)decompressed_u);
          sVar2 = read((int)&compressed,(void *)0x4,1);
          if ((int)sVar2 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            decompressed_u = (float *)trico_realloc(decompressed_u,(ulong)(uint)compressed);
            sVar2 = read((int)decompressed_u,(void *)0x1,(ulong)(uint)compressed);
            if ((int)sVar2 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              trico_decompress(&local_5c,&stack0xffffffffffffffa8,(uint8_t *)decompressed_u);
              trico_free(decompressed_u);
              if (decompressed_v._4_4_ != compressed._4_4_) {
                __assert_fail("nr_of_floats_u == nr_vec2_positions",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x4fe,
                              "int trico_read_vec2_float(void *, float **, enum trico_stream_type)")
                ;
              }
              if (local_5c != decompressed_v._4_4_) {
                __assert_fail("nr_of_floats_v == nr_of_floats_u",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x4ff,
                              "int trico_read_vec2_float(void *, float **, enum trico_stream_type)")
                ;
              }
              if (ppfStack_20 != (float **)0x0) {
                trico_transpose_uv_soa_to_aos(ppfStack_20,pfStack_48,pfStack_58,compressed._4_4_);
              }
              trico_free(pfStack_48);
              trico_free(pfStack_58);
              read_next_stream_type(_nr_of_compressed_bytes);
              a_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int trico_read_vec2_float(void* a, float** uv, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_vec2_positions;
  if (!read(&nr_vec2_positions, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_u;
  uint32_t nr_of_floats_u;
  trico_decompress(&nr_of_floats_u, &decompressed_u, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_v;
  uint32_t nr_of_floats_v;
  trico_decompress(&nr_of_floats_v, &decompressed_v, (const uint8_t*)compressed);

  trico_free(compressed);

  assert(nr_of_floats_u == nr_vec2_positions);
  assert(nr_of_floats_v == nr_of_floats_u);

  if (uv != NULL)
    trico_transpose_uv_soa_to_aos(uv, decompressed_u, decompressed_v, nr_vec2_positions);

  trico_free(decompressed_u);
  trico_free(decompressed_v);

  read_next_stream_type(arch);

  return 1;
  }